

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O0

int64_t bgzf_seek(BGZF *fp,int64_t pos,int where)

{
  off_t oVar1;
  int64_t block_address;
  int block_offset;
  int where_local;
  int64_t pos_local;
  BGZF *fp_local;
  
  if (((*(int *)fp << 0xe) >> 0x1e == 0) && (where == 0)) {
    oVar1 = hseek(fp->fp,pos >> 0x10,0);
    if (oVar1 < 0) {
      *(uint *)fp = *(uint *)fp & 0xffff0000 | *(uint *)fp & 0xffff | 4;
      fp_local = (BGZF *)0xffffffffffffffff;
    }
    else {
      fp->block_length = 0;
      fp->block_address = pos >> 0x10;
      fp->block_offset = (uint)pos & 0xffff;
      fp_local = (BGZF *)0x0;
    }
  }
  else {
    *(uint *)fp = *(uint *)fp & 0xffff0000 | *(uint *)fp & 0xffff | 8;
    fp_local = (BGZF *)0xffffffffffffffff;
  }
  return (int64_t)fp_local;
}

Assistant:

int64_t bgzf_seek(BGZF* fp, int64_t pos, int where)
{
    int block_offset;
    int64_t block_address;

    if (fp->is_write || where != SEEK_SET) {
        fp->errcode |= BGZF_ERR_MISUSE;
        return -1;
    }
    block_offset = pos & 0xFFFF;
    block_address = pos >> 16;
    if (hseek(fp->fp, block_address, SEEK_SET) < 0) {
        fp->errcode |= BGZF_ERR_IO;
        return -1;
    }
    fp->block_length = 0;  // indicates current block has not been loaded
    fp->block_address = block_address;
    fp->block_offset = block_offset;
    return 0;
}